

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

uLong cm_zlib_crc32_combine(uLong crc1,uLong crc2,long len2)

{
  unsigned_long local_238;
  unsigned_long odd [32];
  unsigned_long even [32];
  unsigned_long row;
  ulong uStack_28;
  int n;
  long len2_local;
  uLong crc2_local;
  uLong crc1_local;
  
  crc1_local = crc1;
  if (len2 != 0) {
    local_238 = 0xedb88320;
    even[0x1f] = 1;
    for (row._4_4_ = 1; row._4_4_ < 0x20; row._4_4_ = row._4_4_ + 1) {
      odd[(long)row._4_4_ + -1] = even[0x1f];
      even[0x1f] = even[0x1f] << 1;
    }
    gf2_matrix_square(odd + 0x1f,&local_238);
    gf2_matrix_square(&local_238,odd + 0x1f);
    uStack_28 = len2;
    crc2_local = crc1;
    do {
      gf2_matrix_square(odd + 0x1f,&local_238);
      if ((uStack_28 & 1) != 0) {
        crc2_local = gf2_matrix_times(odd + 0x1f,crc2_local);
      }
      if ((long)uStack_28 >> 1 == 0) break;
      gf2_matrix_square(&local_238,odd + 0x1f);
      if (((long)uStack_28 >> 1 & 1U) != 0) {
        crc2_local = gf2_matrix_times(&local_238,crc2_local);
      }
      uStack_28 = (long)uStack_28 >> 2;
    } while (uStack_28 != 0);
    crc1_local = crc2 ^ crc2_local;
  }
  return crc1_local;
}

Assistant:

uLong ZEXPORT crc32_combine(crc1, crc2, len2)
    uLong crc1;
    uLong crc2;
    z_off_t len2;
{
    int n;
    unsigned long row;
    unsigned long even[GF2_DIM];    /* even-power-of-two zeros operator */
    unsigned long odd[GF2_DIM];     /* odd-power-of-two zeros operator */

    /* degenerate case */
    if (len2 == 0)
        return crc1;

    /* put operator for one zero bit in odd */
    odd[0] = 0xedb88320L;           /* CRC-32 polynomial */
    row = 1;
    for (n = 1; n < GF2_DIM; n++) {
        odd[n] = row;
        row <<= 1;
    }

    /* put operator for two zero bits in even */
    gf2_matrix_square(even, odd);

    /* put operator for four zero bits in odd */
    gf2_matrix_square(odd, even);

    /* apply len2 zeros to crc1 (first square will put the operator for one
       zero byte, eight zero bits, in even) */
    do {
        /* apply zeros operator for this bit of len2 */
        gf2_matrix_square(even, odd);
        if (len2 & 1)
            crc1 = gf2_matrix_times(even, crc1);
        len2 >>= 1;

        /* if no more bits set, then done */
        if (len2 == 0)
            break;

        /* another iteration of the loop with odd and even swapped */
        gf2_matrix_square(odd, even);
        if (len2 & 1)
            crc1 = gf2_matrix_times(odd, crc1);
        len2 >>= 1;

        /* if no more bits set, then done */
    } while (len2 != 0);

    /* return combined crc */
    crc1 ^= crc2;
    return crc1;
}